

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

int __thiscall Cleaner::CleanAll(Cleaner *this,bool generator)

{
  bool bVar1;
  State *pSVar2;
  Edge *pEVar3;
  pointer ppNVar4;
  pointer ppEVar5;
  allocator<char> local_51;
  string local_50;
  
  Reset(this);
  PrintHeader(this);
  LoadDyndeps(this);
  pSVar2 = this->state_;
  ppEVar5 = (pSVar2->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppEVar5 ==
        (pSVar2->edges_).super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      PrintFooter(this);
      return this->status_;
    }
    bVar1 = Edge::is_phony(*ppEVar5);
    if (!bVar1) {
      if (!generator) {
        pEVar3 = *ppEVar5;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"generator",&local_51);
        bVar1 = Edge::GetBindingBool(pEVar3,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar1) goto LAB_0010b942;
      }
      pEVar3 = *ppEVar5;
      for (ppNVar4 = (pEVar3->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppNVar4 !=
          (pEVar3->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppNVar4 = ppNVar4 + 1) {
        Remove(this,&(*ppNVar4)->path_);
        pEVar3 = *ppEVar5;
      }
      RemoveEdgeFiles(this,pEVar3);
    }
LAB_0010b942:
    ppEVar5 = ppEVar5 + 1;
    pSVar2 = this->state_;
  } while( true );
}

Assistant:

int Cleaner::CleanAll(bool generator) {
  Reset();
  PrintHeader();
  LoadDyndeps();
  for (vector<Edge*>::iterator e = state_->edges_.begin();
       e != state_->edges_.end(); ++e) {
    // Do not try to remove phony targets
    if ((*e)->is_phony())
      continue;
    // Do not remove generator's files unless generator specified.
    if (!generator && (*e)->GetBindingBool("generator"))
      continue;
    for (vector<Node*>::iterator out_node = (*e)->outputs_.begin();
         out_node != (*e)->outputs_.end(); ++out_node) {
      Remove((*out_node)->path());
    }

    RemoveEdgeFiles(*e);
  }
  PrintFooter();
  return status_;
}